

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateInterfaceMembers
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  
  field = this->descriptor_;
  if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) {
    WriteFieldDocComment(printer,field);
    io::Printer::Print(printer,&this->variables_,"$deprecation$boolean has$capitalized_name$();\n");
    field = this->descriptor_;
  }
  WriteFieldDocComment(printer,field);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$java.lang.String get$capitalized_name$();\n");
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$com.google.protobuf.ByteString\n    get$capitalized_name$Bytes();\n"
                    );
  return;
}

Assistant:

void ImmutableStringFieldGenerator::
GenerateInterfaceMembers(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$boolean has$capitalized_name$();\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$java.lang.String get$capitalized_name$();\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$com.google.protobuf.ByteString\n"
    "    get$capitalized_name$Bytes();\n");
}